

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
Wrapper<AmountCompression,_const_long_&>::Serialize<SizeComputer>
          (Wrapper<AmountCompression,_const_long_&> *this,SizeComputer *s)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = CompressAmount(*this->m_object);
  lVar3 = 1;
  for (; 0x7f < uVar2; uVar2 = (uVar2 >> 7) - 1) {
    lVar3 = lVar3 + 1;
  }
  s->nSize = s->nSize + lVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

explicit Wrapper(T obj) : m_object(obj) {}